

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_neon_pmull_h_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uintptr_t i;
  uint64_t uVar1;
  uint64_t op2;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  
  uVar2 = *(uint64_t *)((long)vn + (long)((int)desc >> 10) * 8);
  uVar3 = *(uint64_t *)((long)vm + (long)((int)desc >> 10) * 8);
  uVar1 = expand_byte_to_half(uVar2);
  op2 = expand_byte_to_half(uVar3);
  uVar1 = pmull_h(uVar1,op2);
  *(uint64_t *)vd = uVar1;
  uVar2 = expand_byte_to_half(uVar2 >> 0x20);
  uVar3 = expand_byte_to_half(uVar3 >> 0x20);
  uVar2 = pmull_h(uVar2,uVar3);
  *(uint64_t *)((long)vd + 8) = uVar2;
  for (uVar4 = 0x10; uVar4 < (desc >> 2 & 0xf8) + 8; uVar4 = uVar4 + 8) {
    *(undefined8 *)((long)vd + uVar4) = 0;
  }
  return;
}

Assistant:

void HELPER(neon_pmull_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    int hi = simd_data(desc);
    uint64_t *d = vd, *n = vn, *m = vm;
    uint64_t nn = n[hi], mm = m[hi];

    d[0] = pmull_h(expand_byte_to_half(nn), expand_byte_to_half(mm));
    nn >>= 32;
    mm >>= 32;
    d[1] = pmull_h(expand_byte_to_half(nn), expand_byte_to_half(mm));

    clear_tail(d, 16, simd_maxsz(desc));
}